

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::EnumValueOptions::_InternalParse
          (EnumValueOptions *this,char *ptr,ParseContext *ctx)

{
  uint uVar1;
  bool bVar2;
  uint64 uVar3;
  UninterpretedOption *msg;
  uint uVar4;
  char *local_50;
  uint32 tag;
  InternalMetadataWithArena *local_40;
  ExtensionSet *local_38;
  
  local_40 = &this->_internal_metadata_;
  local_38 = &this->_extensions_;
  local_50 = ptr;
  uVar1 = 0;
  do {
    while( true ) {
      uVar4 = uVar1;
      bVar2 = internal::ParseContext::Done(ctx,&local_50);
      if (bVar2) goto LAB_0034db03;
      local_50 = internal::ReadTag(local_50,&tag,0);
      if (local_50 == (char *)0x0) goto LAB_0034daf2;
      uVar1 = uVar4;
      if (tag >> 3 != 999) break;
      if ((char)tag == ':') {
        local_50 = local_50 + -2;
        do {
          local_50 = local_50 + 2;
          msg = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                          (&this->uninterpreted_option_);
          local_50 = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                               (ctx,msg,local_50);
          if (local_50 == (char *)0x0) goto LAB_0034daf2;
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (bVar2 = internal::ExpectTag<7994u>(local_50), bVar2));
      }
      else {
LAB_0034da9d:
        if (((ulong)tag == 0) || ((tag & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
          goto LAB_0034db03;
        }
        if (tag < 8000) {
          local_50 = internal::UnknownFieldParse(tag,local_40,local_50,ctx);
        }
        else {
          local_50 = internal::ExtensionSet::ParseField
                               (local_38,(ulong)tag,local_50,
                                (Message *)_EnumValueOptions_default_instance_,local_40,ctx);
        }
        if (local_50 == (char *)0x0) goto LAB_0034daf2;
      }
    }
    if ((tag >> 3 != 1) || ((char)tag != '\b')) goto LAB_0034da9d;
    uVar3 = internal::ReadVarint(&local_50);
    this->deprecated_ = uVar3 != 0;
    uVar4 = 1;
    uVar1 = 1;
  } while (local_50 != (char *)0x0);
LAB_0034daf2:
  local_50 = (char *)0x0;
LAB_0034db03:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
  return local_50;
}

Assistant:

const char* EnumValueOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool deprecated = 1 [default = false];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}